

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  HuffmanCode *pHVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  HuffmanCode *pHVar12;
  int iVar13;
  uint32_t uVar14;
  int iVar15;
  uint local_48;
  uint local_44;
  size_t local_40;
  byte *local_38;
  
  uVar2 = s->num_block_types[1];
  if (uVar2 < 2) {
LAB_001057b9:
    iVar13 = 0;
  }
  else {
    pHVar12 = s->block_type_trees;
    pHVar4 = s->block_len_trees;
    br = &s->br;
    uVar5 = (s->br).val_;
    uVar3 = (s->br).bit_pos_;
    local_38 = (s->br).next_in;
    local_40 = (s->br).avail_in;
    iVar9 = 0;
    iVar13 = -8;
    iVar15 = -0x32;
    uVar8 = uVar5;
    pbVar6 = local_38;
    sVar11 = local_40;
    while( true ) {
      sVar11 = sVar11 - 1;
      if (0xe < iVar15 + uVar3) break;
      if (sVar11 == 0xffffffffffffffff) {
        iVar13 = SafeDecodeSymbol(pHVar12 + 0x278,br,&local_48);
        if (iVar13 == 0) goto LAB_001057b9;
        goto LAB_00105614;
      }
      (s->br).val_ = uVar8 >> 8;
      uVar8 = uVar8 >> 8 | (ulong)*pbVar6 << 0x38;
      (s->br).val_ = uVar8;
      (s->br).bit_pos_ = iVar13 + uVar3;
      (s->br).avail_in = sVar11;
      (s->br).next_in = pbVar6 + 1;
      iVar9 = iVar9 + 8;
      iVar13 = iVar13 + -8;
      iVar15 = iVar15 + -8;
      pbVar6 = pbVar6 + 1;
    }
    iVar13 = uVar3 - iVar9;
    uVar8 = uVar8 >> ((byte)iVar13 & 0x3f);
    pHVar12 = pHVar12 + 0x278 + (uVar8 & 0xff);
    uVar7 = (uint)pHVar12->bits;
    if (8 < uVar7) {
      iVar13 = (uVar3 - iVar9) + 8;
      pHVar12 = pHVar12 + (ulong)pHVar12->value +
                          (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8] & 0x7f
                                 );
      uVar7 = (uint)pHVar12->bits;
    }
    (s->br).bit_pos_ = uVar7 + iVar13;
    local_48 = (uint)pHVar12->value;
LAB_00105614:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      for (uVar7 = (s->br).bit_pos_ - 0x32; uVar7 < 0xf; uVar7 = uVar7 - 8) {
        sVar11 = (s->br).avail_in;
        if (sVar11 == 0) {
          iVar13 = SafeDecodeSymbol(pHVar4 + 0x18c,br,&local_44);
          if (iVar13 != 0) goto LAB_001056e7;
          goto LAB_00105798;
        }
        uVar8 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        (s->br).val_ = uVar8 >> 8;
        (s->br).val_ = (ulong)*pbVar6 << 0x38 | uVar8 >> 8;
        (s->br).bit_pos_ = uVar7 + 0x2a;
        (s->br).avail_in = sVar11 - 1;
        (s->br).next_in = pbVar6 + 1;
      }
      iVar13 = uVar7 + 0x32;
      uVar8 = br->val_ >> ((byte)iVar13 & 0x3f);
      pHVar12 = pHVar4 + 0x18c + (uVar8 & 0xff);
      uVar10 = (uint)pHVar12->bits;
      if (8 < uVar10) {
        iVar13 = uVar7 + 0x3a;
        pHVar12 = pHVar12 + (ulong)pHVar12->value +
                            (ulong)((uint)(uVar8 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8] &
                                   0x7f);
        uVar10 = (uint)pHVar12->bits;
      }
      (s->br).bit_pos_ = uVar10 + iVar13;
      local_44 = (uint)pHVar12->value;
    }
    else {
      local_44 = s->block_length_index;
    }
LAB_001056e7:
    bVar1 = kBlockLengthPrefixCode[local_44].nbits;
    uVar14 = (s->br).bit_pos_;
    iVar13 = -uVar14;
LAB_001056fe:
    uVar14 = uVar14 - 8;
    if (iVar13 + 0x40U < (uint)bVar1) {
      sVar11 = (s->br).avail_in;
      if (sVar11 != 0) goto code_r0x00105714;
      s->block_length_index = local_44;
LAB_00105798:
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      (s->br).val_ = uVar5;
      (s->br).bit_pos_ = uVar3;
      (s->br).next_in = local_38;
      (s->br).avail_in = local_40;
      goto LAB_001057b9;
    }
    uVar7 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = (uint)bVar1 - iVar13;
    s->block_length[1] =
         (uint)kBlockLengthPrefixCode[local_44].offset +
         ((uint)((s->br).val_ >> (-(char)iVar13 & 0x3fU)) & uVar7);
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_48 == 0) {
      local_48 = s->block_type_rb[2];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[3] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    uVar7 = 0;
    if (uVar2 <= local_48) {
      uVar7 = uVar2;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = local_48 - uVar7;
    s->htree_command = (s->insert_copy_hgroup).htrees[local_48 - uVar7];
    iVar13 = 1;
  }
  return iVar13;
code_r0x00105714:
  uVar8 = (s->br).val_;
  pbVar6 = (s->br).next_in;
  (s->br).val_ = uVar8 >> 8;
  (s->br).val_ = (ulong)*pbVar6 << 0x38 | uVar8 >> 8;
  (s->br).bit_pos_ = uVar14;
  (s->br).avail_in = sVar11 - 1;
  (s->br).next_in = pbVar6 + 1;
  iVar13 = iVar13 + 8;
  goto LAB_001056fe;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}